

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

char * linenoise(char *prompt)

{
  ushort *puVar1;
  bool bVar2;
  linenoiseCompletionCallback *plVar3;
  undefined8 uVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  ssize_t sVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  int *piVar14;
  uint uVar15;
  char *__s;
  char *__maxlen;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auStack_1070 [8];
  char local_1068 [8];
  char buf [4096];
  winsize ws;
  undefined1 auStack_58 [8];
  linenoiseCompletions lc;
  char local_35;
  byte local_34;
  char local_33;
  char local_32;
  byte local_31 [7];
  char c;
  
  auStack_1070 = (undefined1  [8])0x10a080;
  pcVar9 = getenv("TERM");
  if (pcVar9 != (char *)0x0) {
    lVar19 = 0;
    do {
      auStack_1070 = (undefined1  [8])0x10a09e;
      iVar6 = strcasecmp(pcVar9,*(char **)((long)unsupported_term + lVar19));
      if (iVar6 == 0) {
        auStack_1070 = (undefined1  [8])0x10a1f8;
        printf("%s",prompt);
        auStack_1070 = (undefined1  [8])0x10a207;
        fflush(_stdout);
        auStack_1070 = (undefined1  [8])0x10a222;
        pcVar9 = fgets(local_1068,0x1000,_stdin);
        if (pcVar9 == (char *)0x0) {
          return (char *)0x0;
        }
        auStack_1070 = (undefined1  [8])0x10a237;
        for (sVar11 = strlen(local_1068);
            (sVar11 != 0 && ((local_1068[sVar11 - 1] == '\r' || (local_1068[sVar11 - 1] == '\n'))));
            sVar11 = sVar11 - 1) {
          local_1068[sVar11 - 1] = '\0';
        }
        goto LAB_0010aa1b;
      }
      lVar19 = lVar19 + 8;
    } while (lVar19 != 0x18);
  }
  auStack_1070 = (undefined1  [8])0x10a0b7;
  iVar6 = isatty(0);
  if (iVar6 == 0) {
    auStack_1070 = (undefined1  [8])0x10a283;
    pcVar9 = fgets(local_1068,0x1000,_stdin);
    if (pcVar9 == (char *)0x0) {
      return (char *)0x0;
    }
    auStack_1070 = (undefined1  [8])0x10a298;
    sVar11 = strlen(local_1068);
    iVar6 = (int)sVar11;
    if (iVar6 == 0) goto LAB_0010aa1b;
    if (local_1068[iVar6 + -1] == '\n') {
      local_1068[iVar6 + -1] = '\0';
      goto LAB_0010aa1b;
    }
  }
  else {
    auStack_1070 = (undefined1  [8])0x10a0c9;
    iVar6 = linenoiseEnableRawMode(0);
    if (iVar6 == -1) {
      return (char *)0x0;
    }
    ls.ifd = 0;
    ls.ofd = 1;
    ls.buf = local_1068;
    ls.buflen = 0x1000;
    auStack_1070 = (undefined1  [8])0x10a10b;
    ls.prompt = prompt;
    ls.plen = strlen(prompt);
    ls.pos = 0;
    ls.oldpos = 0;
    ls.len = 0;
    iVar8 = 0x5413;
    iVar16 = 1;
    auStack_1070 = (undefined1  [8])0x10a13f;
    iVar6 = ioctl(1,0x5413,buf + 0xff8);
    if (buf._4090_2_ == 0 || iVar6 == -1) {
      auStack_1070 = (undefined1  [8])0x10a160;
      iVar6 = getCursorPosition(iVar16,iVar8);
      uVar15 = 0x50;
      if (iVar6 != -1) {
        iVar8 = 0x10dc7a;
        iVar16 = 1;
        auStack_1070 = (undefined1  [8])0x10a188;
        sVar10 = write(1,"\x1b[999C",6);
        if (sVar10 == 6) {
          auStack_1070 = (undefined1  [8])0x10a197;
          uVar7 = getCursorPosition(iVar16,iVar8);
          if ((uVar7 != 0xffffffff) && (uVar15 = uVar7, iVar6 < (int)uVar7)) {
            auStack_1070 = (undefined1  [8])0x10a1c4;
            snprintf(auStack_58,0x20,"\x1b[%dD");
            auStack_1070 = (undefined1  [8])0x10a1cc;
            sVar11 = strlen(auStack_58);
            auStack_1070 = (undefined1  [8])0x10a1dc;
            write(1,auStack_58,sVar11);
          }
        }
      }
    }
    else {
      uVar15 = (uint)(ushort)buf._4090_2_;
    }
    ls.cols = (size_t)(int)uVar15;
    ls.maxrows = 0;
    ls.history_index = 0;
    *ls.buf = '\0';
    ls.buflen = ls.buflen - 1;
    auStack_1070 = (undefined1  [8])0x10a304;
    linenoiseHistoryAdd("");
    auStack_1070 = (undefined1  [8])0x10a319;
    sVar10 = write(ls.ofd,prompt,ls.plen);
    if (sVar10 == -1) {
LAB_0010a9dc:
      uVar18 = 0xffffffff;
    }
    else {
      auStack_1070 = (undefined1  [8])0x10a337;
      sVar10 = read(ls.ifd,local_31,1);
      iVar6 = (int)sVar10;
      pcVar9 = ls.buf;
      plVar3 = completionCallback;
      while (ls.buf = pcVar9, completionCallback = plVar3, 0 < iVar6) {
        uVar15 = (uint)local_31[0];
        if (plVar3 != (linenoiseCompletionCallback *)0x0 && local_31[0] == 9) {
          auStack_58 = (undefined1  [8])0x0;
          lc.path = 0;
          lc._4_4_ = 0;
          lc.len = 0;
          local_32 = '\0';
          auStack_1070 = (undefined1  [8])0x10a391;
          pcVar12 = strrchr(pcVar9,0x20);
          __s = pcVar12 + 1;
          if (pcVar12 == (char *)0x0) {
            __s = pcVar9;
          }
          auStack_1070 = (undefined1  [8])0x10a3a8;
          (*plVar3)(pcVar9,__s,(linenoiseCompletions *)auStack_58);
          sVar5 = lc.len;
          uVar4 = lc._0_8_;
          if (lc._0_8_ == 0) {
            auStack_1070 = (undefined1  [8])0x10a44d;
            fputc(7,_stderr);
            auStack_1070 = (undefined1  [8])0x10a455;
            fflush(_stderr);
            uVar15 = 0;
LAB_0010a458:
            auStack_1070 = (undefined1  [8])0x10a460;
            freeCompletions((linenoiseCompletions *)auStack_58);
LAB_0010a5ad:
            if ((int)uVar15 < 0) break;
          }
          else {
            auStack_1070 = (undefined1  [8])0x10a3c1;
            pcVar9 = strdup(*(char **)lc.len);
            if (uVar4 != 1) {
              uVar18 = 1;
              do {
                pcVar12 = *(char **)(sVar5 + uVar18 * 8);
                auStack_1070 = (undefined1  [8])0x10a3e1;
                sVar11 = strlen(pcVar12);
                if (sVar11 == 0) {
                  uVar13 = 0;
                }
                else {
                  uVar15 = 1;
                  uVar13 = 0;
                  do {
                    if (pcVar12[uVar13] != pcVar9[uVar13]) break;
                    uVar13 = (ulong)uVar15;
                    uVar15 = uVar15 + 1;
                  } while (uVar13 < sVar11);
                }
                pcVar9[uVar13] = '\0';
                uVar18 = (ulong)((int)uVar18 + 1);
              } while (uVar18 < (ulong)uVar4);
            }
            if (auStack_58._0_4_ != 0) {
              auStack_1070 = (undefined1  [8])0x10a42c;
              pcVar12 = strrchr(__s,0x2f);
              if (pcVar12 != (char *)0x0) {
                __s = pcVar12 + 1;
              }
            }
            if (uVar4 == 1) {
              auStack_1070 = (undefined1  [8])0x10a477;
              sVar11 = strlen(pcVar9);
              if (pcVar9[sVar11 - 1] == '/') goto LAB_0010a47f;
              __maxlen = ls.buf + (ls.buflen - (long)__s);
              pcVar12 = "%s ";
            }
            else {
LAB_0010a47f:
              __maxlen = ls.buf + (ls.buflen - (long)__s);
              pcVar12 = "%s";
            }
            auStack_1070 = (undefined1  [8])0x10a4c1;
            iVar6 = snprintf(__s,(size_t)__maxlen,pcVar12,pcVar9);
            auStack_1070 = (undefined1  [8])0x10a4cc;
            free(pcVar9);
            ls.pos = (size_t)(__s + ((long)iVar6 - (long)ls.buf));
            auStack_1070 = (undefined1  [8])0x10a4ec;
            ls.len = ls.pos;
            linenoiseRefreshLine();
            uVar15 = 0;
            if (lc._0_8_ != 1) {
              auStack_1070 = (undefined1  [8])0x10a523;
              sVar10 = read(ls.ifd,&local_32,1);
              if ((int)sVar10 < 1) {
LAB_0010a949:
                auStack_1070 = (undefined1  [8])0x10a952;
                freeCompletions((linenoiseCompletions *)auStack_58);
                break;
              }
              uVar15 = (uint)local_32;
              if (uVar15 != 9) {
                auStack_1070 = (undefined1  [8])0x10a5a9;
                freeCompletions((linenoiseCompletions *)auStack_58);
                goto LAB_0010a5ad;
              }
              auStack_1070 = (undefined1  [8])0x10a54c;
              ioctl(ls.ifd,0x5413,buf + 0xff8);
              sVar5 = lc.len;
              auStack_1070 = (undefined1  [8])0x10a558;
              sVar11 = strlen(*(char **)lc.len);
              uVar4 = lc._0_8_;
              uVar18 = sVar11;
              if (1 < (ulong)lc._0_8_) {
                uVar13 = 1;
                uVar17 = 2;
                do {
                  auStack_1070 = (undefined1  [8])0x10a57d;
                  uVar18 = strlen(*(char **)(sVar5 + uVar13 * 8));
                  if (uVar18 <= (sVar11 & 0xffffffff)) {
                    uVar18 = sVar11;
                  }
                  sVar11 = uVar18 & 0xffffffff;
                  bVar2 = uVar17 < (ulong)uVar4;
                  uVar13 = uVar17;
                  uVar17 = (ulong)((int)uVar17 + 1);
                } while (bVar2);
              }
              uVar7 = 0xffffffff;
              iVar6 = -2;
              do {
                iVar6 = iVar6 + (int)uVar18 + 2;
                uVar7 = uVar7 + 1;
              } while (iVar6 <= (int)(uint)(ushort)buf._4090_2_);
              if (uVar7 != 0) {
                while (uVar15 = (uint)local_32, uVar15 == 9) {
                  if (ls.rawmode != 0) {
                    auStack_1070 = (undefined1  [8])0x10a7dc;
                    iVar6 = tcsetattr(ls.ifd,2,(termios *)&orig_termios);
                    if (iVar6 != -1) {
                      ls.rawmode = 0;
                    }
                  }
                  auStack_1070 = (undefined1  [8])0x10a7f5;
                  putchar(10);
                  if (lc._0_8_ != 0) {
                    uVar15 = 1;
                    uVar13 = 0;
                    do {
                      auStack_1070 = (undefined1  [8])0x10a819;
                      printf("%-*s",uVar18 & 0xffffffff,*(undefined8 *)(lc.len + uVar13 * 8));
                      if ((uVar15 % uVar7 == 0) || (lc._0_8_ - 1 == uVar13)) {
                        auStack_1070 = (undefined1  [8])0x10a83b;
                        putchar(10);
                      }
                      else {
                        auStack_1070 = (undefined1  [8])0x10a84b;
                        printf("  ");
                      }
                      uVar13 = (ulong)uVar15;
                      uVar15 = uVar15 + 1;
                    } while (uVar13 < (ulong)lc._0_8_);
                  }
                  auStack_1070 = (undefined1  [8])0x10a862;
                  linenoiseEnableRawMode(ls.ifd);
                  auStack_1070 = (undefined1  [8])0x10a867;
                  linenoiseRefreshLine();
                  auStack_1070 = (undefined1  [8])0x10a87b;
                  sVar10 = read(ls.ifd,&local_32,1);
                  if ((int)sVar10 < 1) goto LAB_0010a949;
                }
                goto LAB_0010a458;
              }
              uVar15 = 9;
            }
            auStack_1070 = (undefined1  [8])0x10a502;
            freeCompletions((linenoiseCompletions *)auStack_58);
            local_31[0] = (byte)uVar15;
          }
          if (uVar15 != 0) goto LAB_0010a5bf;
          goto switchD_0010a8ca_caseD_45;
        }
LAB_0010a5bf:
        sVar5 = ls.pos;
        switch(uVar15 & 0xff) {
        case 1:
switchD_0010a5d9_caseD_1:
          if (ls.pos != 0) {
            ls.pos = 0;
            sVar5 = ls.pos;
            goto LAB_0010a917;
          }
          break;
        case 2:
switchD_0010a5d9_caseD_2:
          if (ls.pos != 0) {
            sVar5 = ls.pos - 1;
            goto LAB_0010a917;
          }
          break;
        case 3:
          auStack_1070 = (undefined1  [8])0x10a962;
          piVar14 = __errno_location();
          *piVar14 = 0xb;
          goto LAB_0010a9dc;
        case 4:
          if (ls.len == 0) {
            lVar19 = (long)history_len;
            history_len = history_len + -1;
            auStack_1070 = (undefined1  [8])0x10a9dc;
            free(history[lVar19 + -1]);
            goto LAB_0010a9dc;
          }
LAB_0010a6ff:
          auStack_1070 = (undefined1  [8])0x10a70b;
          linenoiseEditDelete(&ls);
          break;
        case 5:
switchD_0010a5d9_caseD_5:
          sVar5 = ls.len;
          if (ls.pos != ls.len) goto LAB_0010a917;
          break;
        case 6:
switchD_0010a5d9_caseD_6:
          if (ls.pos != ls.len) {
LAB_0010a90d:
            sVar5 = ls.pos + 1;
            goto LAB_0010a917;
          }
          break;
        case 7:
        case 9:
        case 10:
        case 0xf:
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
          goto switchD_0010a5d9_caseD_7;
        case 8:
switchD_0010a5d9_caseD_8:
          auStack_1070 = (undefined1  [8])0x10a60a;
          linenoiseEditBackspace(&ls);
          break;
        case 0xb:
          local_1068[ls.pos] = '\0';
          ls.len = ls.pos;
          goto LAB_0010a917;
        case 0xc:
          auStack_1070 = (undefined1  [8])0x10a6ec;
          write(1,"\x1b[H\x1b[2J",7);
          sVar5 = ls.pos;
          goto LAB_0010a917;
        case 0xd:
          lVar19 = (long)history_len;
          history_len = history_len + -1;
          auStack_1070 = (undefined1  [8])0x10a98c;
          free(history[lVar19 + -1]);
          uVar18 = ls.len;
          if ((mlmode != 0) && (ls.pos != ls.len)) {
            ls.pos = ls.len;
            auStack_1070 = (undefined1  [8])0x10a9b1;
            linenoiseRefreshLine();
            uVar18 = ls.len;
          }
          goto LAB_0010a9e1;
        case 0xe:
switchD_0010a5d9_caseD_e:
          iVar6 = 0;
          goto LAB_0010a927;
        case 0x10:
switchD_0010a5d9_caseD_10:
          iVar6 = 1;
LAB_0010a927:
          auStack_1070 = (undefined1  [8])0x10a92c;
          linenoiseEditHistoryNext(&ls,iVar6);
          break;
        case 0x14:
          if (ls.pos < ls.len && ls.pos != 0) {
            puVar1 = (ushort *)(local_1068 + (ls.pos - 1));
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            if (ls.pos != ls.len - 1) goto LAB_0010a90d;
            goto LAB_0010a917;
          }
          break;
        case 0x15:
          local_1068[0] = '\0';
          ls.len = 0;
          sVar5 = 0;
LAB_0010a917:
          ls.pos = sVar5;
          auStack_1070 = (undefined1  [8])0x10a91c;
          linenoiseRefreshLine();
          break;
        case 0x17:
          auStack_1070 = (undefined1  [8])0x10a779;
          linenoiseEditDeletePrevWord(&ls);
          break;
        case 0x1b:
          auStack_1070 = (undefined1  [8])0x10a655;
          sVar10 = read(ls.ifd,&local_35,1);
          if (sVar10 != -1) {
            auStack_1070 = (undefined1  [8])0x10a673;
            sVar10 = read(ls.ifd,&local_34,1);
            if (sVar10 != -1) {
              if (local_35 == 'O') {
                if (local_34 == 0x46) goto switchD_0010a5d9_caseD_5;
                if (local_34 == 0x48) goto switchD_0010a5d9_caseD_1;
              }
              else if (local_35 == '[') {
                if ((byte)(local_34 - 0x30) < 10) {
                  auStack_1070 = (undefined1  [8])0x10a6b7;
                  sVar10 = read(ls.ifd,&local_33,1);
                  if (((sVar10 != -1) && (local_33 == '~')) && (local_34 == 0x33))
                  goto LAB_0010a6ff;
                }
                else {
                  switch(local_34) {
                  case 0x41:
                    goto switchD_0010a5d9_caseD_10;
                  case 0x42:
                    goto switchD_0010a5d9_caseD_e;
                  case 0x43:
                    goto switchD_0010a5d9_caseD_6;
                  case 0x44:
                    goto switchD_0010a5d9_caseD_2;
                  case 0x46:
                    goto switchD_0010a5d9_caseD_5;
                  case 0x48:
                    goto switchD_0010a5d9_caseD_1;
                  }
                }
              }
            }
          }
          break;
        default:
          if ((uVar15 & 0xff) == 0x7f) goto switchD_0010a5d9_caseD_8;
switchD_0010a5d9_caseD_7:
          auStack_1070 = (undefined1  [8])0x10a61f;
          iVar6 = linenoiseEditInsert(&ls,(char)uVar15);
          if (iVar6 != 0) goto LAB_0010a9dc;
        }
switchD_0010a8ca_caseD_45:
        auStack_1070 = (undefined1  [8])0x10a93f;
        sVar10 = read(ls.ifd,local_31,1);
        pcVar9 = ls.buf;
        plVar3 = completionCallback;
        iVar6 = (int)sVar10;
      }
      uVar18 = ls.len & 0xffffffff;
    }
LAB_0010a9e1:
    iVar6 = (int)uVar18;
    if (ls.rawmode != 0) {
      auStack_1070 = (undefined1  [8])0x10a9fd;
      iVar8 = tcsetattr(0,2,(termios *)&orig_termios);
      if (iVar8 != -1) {
        ls.rawmode = 0;
      }
    }
    auStack_1070 = (undefined1  [8])0x10aa16;
    putchar(10);
  }
  if (iVar6 == -1) {
    return (char *)0x0;
  }
LAB_0010aa1b:
  auStack_1070 = (undefined1  [8])0x10aa27;
  pcVar9 = strdup(local_1068);
  return pcVar9;
}

Assistant:

char *linenoise(const char *prompt) {
    char buf[LINENOISE_MAX_LINE];
    int count;

    if (isUnsupportedTerm()) {
        size_t len;

        printf("%s",prompt);
        fflush(stdout);
        if (fgets(buf,LINENOISE_MAX_LINE,stdin) == NULL) return NULL;
        len = strlen(buf);
        while(len && (buf[len-1] == '\n' || buf[len-1] == '\r')) {
            len--;
            buf[len] = '\0';
        }
        return strdup(buf);
    } else {
        count = linenoiseRaw(buf,LINENOISE_MAX_LINE,prompt);
        if (count == -1) return NULL;
        return strdup(buf);
    }
}